

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

CFGNode * __thiscall dxil_spv::CFGNode::get_outer_selection_dominator(CFGNode *this)

{
  CFGNode **ppCVar1;
  bool bVar2;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var3;
  CFGNode *start_node;
  
  start_node = this->immediate_dominator;
  if (start_node == (CFGNode *)0x0) {
    __assert_fail("immediate_dominator",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                  ,0x254,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
  }
  do {
    if ((((start_node->ir).terminator.type == Switch) ||
        (bVar2 = post_dominates(this,start_node), !bVar2)) ||
       ((start_node->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (start_node->pred).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      return start_node;
    }
    while( true ) {
      ppCVar1 = &start_node->immediate_dominator;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                        ((start_node->headers).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (start_node->headers).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,ppCVar1);
      if (_Var3._M_current ==
          (start_node->headers).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      start_node = *ppCVar1;
    }
    bVar2 = post_dominates(this,start_node);
  } while ((!bVar2) || (start_node = *ppCVar1, start_node != (CFGNode *)0x0));
  __assert_fail("node->immediate_dominator",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                ,0x264,"CFGNode *dxil_spv::CFGNode::get_outer_selection_dominator()");
}

Assistant:

CFGNode *CFGNode::get_outer_selection_dominator()
{
	assert(immediate_dominator);
	auto *node = immediate_dominator;

	// We need to find an immediate dominator which we do not post-dominate.
	// That first idom is considered the outer selection header.
	while (node->ir.terminator.type != Terminator::Type::Switch && post_dominates(node))
	{
		if (node->pred.empty())
			break;

		// Skip from merge block to header.
		while (std::find(node->headers.begin(), node->headers.end(), node->immediate_dominator) != node->headers.end())
			node = node->immediate_dominator;

		if (post_dominates(node))
		{
			assert(node->immediate_dominator);
			node = node->immediate_dominator;
		}
	}

	return node;
}